

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floatingpoint_tests.cpp
# Opt level: O2

void __thiscall
floatingpoint_test::iu_FloatingpointTest_x_iutest_x_NINF_Test<long_double>::Body
          (iu_FloatingpointTest_x_iutest_x_NINF_Test<long_double> *this)

{
  floating_point<long_double> *in_R9;
  _Myt f;
  AssertionResult iutest_ar;
  Fixed local_198;
  
  local_198.super_Message.m_stream.super_iu_stringstream._10_6_ = 0;
  local_198.super_Message.m_stream.super_iu_stringstream._0_8_ =
       SUB108(-(longdouble)FloatingpointTest<long_double>::ONE._0_10_ /
              (longdouble)FloatingpointTest<long_double>::ZERO._0_10_,0);
  local_198.super_Message.m_stream.super_iu_stringstream._8_2_ =
       SUB102((unkuint10)
              (-(longdouble)FloatingpointTest<long_double>::ONE._0_10_ /
              (longdouble)FloatingpointTest<long_double>::ZERO._0_10_) >> 0x40,0);
  f.m_v.iv._0_8_ = 0x8000000000000000;
  f.m_v.iv._8_8_ = 0xffff;
  iutest::internal::
  CmpHelperEQ<iutest::floating_point<long_double>,iutest::floating_point<long_double>>
            (&iutest_ar,(internal *)"FloatType(a/b)","FloatType::NINF()",(char *)&local_198,&f,in_R9
            );
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&f,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/floatingpoint_tests.cpp"
               ,0x50,iutest_ar.m_message._M_dataplus._M_p);
    iutest::AssertionHelper::operator=((AssertionHelper *)&f,&local_198);
    std::__cxx11::string::~string((string *)&f);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST(FloatingpointTest, NINF)
{
    typedef typename TestFixture::ftype FloatType;
    TypeParam a= - TestFixture::ONE;
    TypeParam b=TestFixture::ZERO;
    IUTEST_EXPECT_EQ(FloatType(a/b), FloatType::NINF());
}